

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,PolicyID id,PolicyStatus status)

{
  bool bVar1;
  PolicyStatus PVar2;
  PolicyID id_00;
  PolicyID id_01;
  string msg;
  string local_40;
  
  if (status != NEW) {
    PVar2 = cmPolicies::GetPolicyStatus(id);
    if (PVar2 == REQUIRED_ALWAYS) {
      cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_(&local_40,(cmPolicies *)(ulong)id,id_00);
      IssueMessage(this,FATAL_ERROR,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
    if (((int)id < 0x44 && status == OLD) &&
       ((bVar1 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance), id != CMP0065 ||
        (!bVar1)))) {
      cmPolicies::GetPolicyDeprecatedWarning_abi_cxx11_(&local_40,(cmPolicies *)(ulong)id,id_01);
      IssueMessage(this,DEPRECATION_WARNING,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
  }
  cmStateSnapshot::SetPolicy(&this->StateSnapshot,id,status);
  return true;
}

Assistant:

bool cmMakefile::SetPolicy(cmPolicies::PolicyID id,
                           cmPolicies::PolicyStatus status)
{
  // A REQUIRED_ALWAYS policy may be set only to NEW.
  if (status != cmPolicies::NEW &&
      cmPolicies::GetPolicyStatus(id) == cmPolicies::REQUIRED_ALWAYS) {
    std::string msg = cmPolicies::GetRequiredAlwaysPolicyError(id);
    this->IssueMessage(MessageType::FATAL_ERROR, msg);
    return false;
  }

  // Deprecate old policies, especially those that require a lot
  // of code to maintain the old behavior.
  if (status == cmPolicies::OLD && id <= cmPolicies::CMP0067 &&
      !(this->GetCMakeInstance()->GetIsInTryCompile() &&
        (
          // Policies set by cmCoreTryCompile::TryCompileCode.
          id == cmPolicies::CMP0065))) {
    this->IssueMessage(MessageType::DEPRECATION_WARNING,
                       cmPolicies::GetPolicyDeprecatedWarning(id));
  }

  this->StateSnapshot.SetPolicy(id, status);
  return true;
}